

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::MetafTime> *
metaf::MetafTime::fromStringDDHHMM(optional<metaf::MetafTime> *__return_storage_ptr__,string *s)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  if (s->_M_string_length == 6) {
    iVar6 = 0;
    lVar10 = 0;
    iVar8 = 0;
    do {
      cVar7 = (s->_M_dataplus)._M_p[lVar10];
      if ((byte)(cVar7 - 0x3aU) < 0xf6) {
        cVar7 = '\0';
        goto LAB_001a6acf;
      }
      iVar8 = (uint)(byte)(cVar7 - 0x30) + iVar8 * 10;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 2);
    cVar7 = '\x01';
    iVar6 = iVar8;
LAB_001a6acf:
    uVar5 = 0;
    lVar10 = 0;
    do {
      cVar2 = (s->_M_dataplus)._M_p[lVar10 + 2];
      if ((byte)(cVar2 - 0x3aU) < 0xf6) {
        uVar5 = 0;
        bVar3 = false;
        goto LAB_001a6b43;
      }
      uVar5 = (uint)(byte)(cVar2 - 0x30) + uVar5 * 10;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 2);
    bVar3 = true;
LAB_001a6b43:
    uVar9 = 0;
    lVar10 = 0;
    do {
      cVar2 = (s->_M_dataplus)._M_p[lVar10 + 4];
      if ((byte)(cVar2 - 0x3aU) < 0xf6) {
        uVar9 = 0;
        bVar4 = false;
        goto LAB_001a6b87;
      }
      uVar9 = (uint)(byte)(cVar2 - 0x30) + uVar9 * 10;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 2);
    bVar4 = true;
LAB_001a6b87:
    if (((cVar7 != '\0') && (bVar3)) && (bVar4)) {
      *(ulong *)&(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload =
           (ulong)CONCAT14(cVar7,iVar6);
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue = uVar5;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = uVar9;
LAB_001a6bb7:
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  else if (s->_M_string_length == 4) {
    lVar10 = 0;
    uVar5 = 0;
    do {
      cVar7 = (s->_M_dataplus)._M_p[lVar10];
      bVar1 = cVar7 - 0x3a;
      if (bVar1 < 0xf6) {
        uVar5 = 0;
        break;
      }
      uVar5 = (uint)(byte)(cVar7 - 0x30) + uVar5 * 10;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 2);
    uVar9 = 0;
    lVar10 = 0;
    do {
      cVar7 = (s->_M_dataplus)._M_p[lVar10 + 2];
      if ((byte)(cVar7 - 0x3aU) < 0xf6) {
        uVar9 = 0;
        bVar3 = false;
        goto LAB_001a6b17;
      }
      uVar9 = (uint)(byte)(cVar7 - 0x30) + uVar9 * 10;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 2);
    bVar3 = true;
LAB_001a6b17:
    if ((0xf5 < bVar1) && (bVar3)) {
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue = uVar5;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = uVar9;
      goto LAB_001a6bb7;
    }
  }
  (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = 0;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<MetafTime> MetafTime::fromStringDDHHMM(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d)?(\\d\\d)(\\d\\d)");
	static const std::optional<MetafTime> error;
	if (s.length() == 4) {
		const auto hour = strToUint(s, 0, 2);
		const auto minute = strToUint(s, 2, 2);
		if (!hour.has_value() || !minute.has_value()) return error;
		MetafTime metafTime;
		metafTime.hourValue = *hour;
		metafTime.minuteValue = *minute;
		return metafTime;
	}
	if (s.length() == 6) {
		const auto day = strToUint(s, 0, 2);
		const auto hour = strToUint(s, 2, 2);
		const auto minute = strToUint(s, 4, 2);
		if (!day.has_value() || !hour.has_value() || !minute.has_value()) return error;
		MetafTime metafTime;
		metafTime.dayValue = day;
		metafTime.hourValue = *hour;
		metafTime.minuteValue = *minute;
		return metafTime;
	}
	return error;
}